

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::CompilerGLSL::flush_phi(CompilerGLSL *this,BlockID from,BlockID to)

{
  VariableID *ts_1;
  uint uVar1;
  Phi *pPVar2;
  bool bVar3;
  uint uVar4;
  SPIRBlock *pSVar5;
  SPIRVariable *pSVar6;
  long lVar7;
  size_type sVar8;
  SPIRType *type;
  char *pcVar9;
  ulong uVar10;
  value_type *__v;
  Phi *pPVar11;
  long lVar12;
  Phi *ts;
  long lVar13;
  char (*ts_2) [6];
  string rhs;
  string lhs;
  string local_88;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  temporary_phi_variables;
  
  pSVar5 = Compiler::get<diligent_spirv_cross::SPIRBlock>(&this->super_Compiler,to.id);
  if ((pSVar5->ignore_phi_from_block).id != from.id) {
    temporary_phi_variables._M_h._M_buckets = &temporary_phi_variables._M_h._M_single_bucket;
    temporary_phi_variables._M_h._M_bucket_count = 1;
    temporary_phi_variables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    temporary_phi_variables._M_h._M_element_count = 0;
    temporary_phi_variables._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    temporary_phi_variables._M_h._M_rehash_policy._M_next_resize = 0;
    temporary_phi_variables._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pPVar2 = (pSVar5->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr;
    lVar12 = 0;
    pPVar11 = pPVar2;
    for (ts = pPVar2;
        ts != pPVar11 + (pSVar5->phi_variables).
                        super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.buffer_size;
        ts = ts + 1) {
      if ((ts->parent).id == from.id) {
        pSVar6 = Compiler::get<diligent_spirv_cross::SPIRVariable>
                           (&this->super_Compiler,(ts->function_variable).id);
        ts_1 = &ts->function_variable;
        if ((pSVar6->loop_variable == true) && (pSVar6->loop_variable_enable == false)) {
          (pSVar6->static_expression).id = (ts->local_variable).id;
        }
        else {
          flush_variable_declaration(this,ts_1->id);
          pPVar11 = (pSVar5->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
                    ptr;
          ts_2 = (char (*) [6])
                 ((pSVar5->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
                  buffer_size * 0xc);
          lVar13 = lVar12;
          for (lVar7 = (long)(*ts_2 + (long)pPVar11 + (-0xc - (long)ts)) / 0xc >> 2; 0 < lVar7;
              lVar7 = lVar7 + -1) {
            uVar4 = *(uint *)((long)&pPVar2[1].local_variable.id + lVar13);
            uVar1 = ts_1->id;
            uVar10 = (ulong)uVar1;
            if ((uVar4 == uVar1) && (*(uint32_t *)((long)&pPVar2[1].parent.id + lVar13) == from.id))
            {
              pcVar9 = (char *)((long)&pPVar2[1].local_variable.id + lVar13);
              uVar10 = (ulong)uVar4;
              goto LAB_00652c6c;
            }
            if ((*(uint *)((long)&pPVar2[2].local_variable.id + lVar13) == uVar1) &&
               (*(uint32_t *)((long)&pPVar2[2].parent.id + lVar13) == from.id)) {
              pcVar9 = (char *)((long)&pPVar2[2].local_variable.id + lVar13);
              goto LAB_00652c6c;
            }
            if ((*(uint *)((long)&pPVar2[3].local_variable.id + lVar13) == uVar1) &&
               (*(uint32_t *)((long)&pPVar2[3].parent.id + lVar13) == from.id)) {
              pcVar9 = (char *)((long)&pPVar2[3].local_variable.id + lVar13);
              goto LAB_00652c6c;
            }
            if ((*(uint *)((long)&pPVar2[4].local_variable.id + lVar13) == uVar1) &&
               (*(uint32_t *)((long)&pPVar2[4].parent.id + lVar13) == from.id)) {
              pcVar9 = (char *)((long)&pPVar2[4].local_variable.id + lVar13);
              goto LAB_00652c6c;
            }
            lVar13 = lVar13 + 0x30;
          }
          lVar7 = (long)((long)ts_2 + (long)pPVar11 + ((-0xc - (long)pPVar2) - lVar13)) / 0xc;
          pcVar9 = (char *)((long)&pPVar2[1].local_variable.id + lVar13);
          if (lVar7 == 3) {
            uVar10 = (ulong)*(uint *)pcVar9;
            uVar4 = ts_1->id;
            if ((*(uint *)pcVar9 != uVar4) ||
               (*(uint32_t *)((long)&pPVar2[1].parent.id + lVar13) != from.id)) {
              pcVar9 = (char *)((long)&pPVar2[2].local_variable.id + lVar13);
              goto LAB_00652c48;
            }
LAB_00652c6c:
            if (pcVar9 != *ts_2 + (long)pPVar11) {
              if (pSVar6->allocate_temporary_copy == false) {
                pSVar6->allocate_temporary_copy = true;
                Compiler::force_recompile(&this->super_Compiler);
                uVar10 = (ulong)ts_1->id;
              }
              (*(this->super_Compiler)._vptr_Compiler[6])(&lhs,this,uVar10,1);
              ts_2 = (char (*) [6])0x7dcf83;
              statement<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>&,char_const(&)[6],char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                        (this,(char (*) [2])0x801cf9,ts_1,(char (*) [6])0x6ef1e6,
                         (char (*) [4])0x7dcf83,&lhs,(char (*) [2])0x800eb9);
              ::std::__cxx11::string::~string((string *)&lhs);
              lhs._M_dataplus._M_p._0_4_ = ts_1->id;
              ::std::__detail::
              _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((__ireturn_type *)&temporary_phi_variables,
                       (_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&lhs,__v);
            }
          }
          else {
            if (lVar7 == 2) {
              uVar4 = ts_1->id;
LAB_00652c48:
              if ((*(uint *)pcVar9 != uVar4) || (*(uint *)(pcVar9 + 4) != from.id)) {
                pcVar9 = pcVar9 + 0xc;
                goto LAB_00652c59;
              }
              uVar10 = (ulong)uVar4;
              goto LAB_00652c6c;
            }
            if (lVar7 == 1) {
              uVar4 = ts_1->id;
LAB_00652c59:
              if ((*(uint *)pcVar9 == uVar4) &&
                 (uVar10 = (ulong)uVar4, *(uint *)(pcVar9 + 4) == from.id)) goto LAB_00652c6c;
            }
          }
          to_expression_abi_cxx11_(&lhs,this,ts_1->id,true);
          rhs._M_dataplus._M_p = (pointer)&rhs.field_2;
          rhs._M_string_length = 0;
          rhs.field_2._M_local_buf[0] = '\0';
          local_88._M_dataplus._M_p._0_4_ = (ts->local_variable).id;
          sVar8 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&temporary_phi_variables._M_h,(key_type_conflict *)&local_88);
          if (sVar8 == 0) {
            to_pointer_expression_abi_cxx11_(&local_88,this,(ts->local_variable).id,true);
          }
          else {
            join<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>&,char_const(&)[6]>
                      (&local_88,(diligent_spirv_cross *)0x801cf9,(char (*) [2])ts,
                       (TypedID<(diligent_spirv_cross::Types)0> *)0x6ef1e6,ts_2);
          }
          ::std::__cxx11::string::operator=((string *)&rhs,(string *)&local_88);
          ::std::__cxx11::string::~string((string *)&local_88);
          type = Compiler::get<diligent_spirv_cross::SPIRType>
                           (&this->super_Compiler,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc);
          bVar3 = optimize_read_modify_write(this,type,&lhs,&rhs);
          if (!bVar3) {
            statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (this,&lhs,(char (*) [4])0x7dcf83,&rhs,(char (*) [2])0x800eb9);
          }
          ::std::__cxx11::string::~string((string *)&rhs);
          ::std::__cxx11::string::~string((string *)&lhs);
        }
        Compiler::register_write(&this->super_Compiler,ts_1->id);
        pPVar11 = (pSVar5->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr
        ;
      }
      lVar12 = lVar12 + 0xc;
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&temporary_phi_variables._M_h);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_phi(BlockID from, BlockID to)
{
	auto &child = get<SPIRBlock>(to);
	if (child.ignore_phi_from_block == from)
		return;

	unordered_set<uint32_t> temporary_phi_variables;

	for (auto itr = begin(child.phi_variables); itr != end(child.phi_variables); ++itr)
	{
		auto &phi = *itr;

		if (phi.parent == from)
		{
			auto &var = get<SPIRVariable>(phi.function_variable);

			// A Phi variable might be a loop variable, so flush to static expression.
			if (var.loop_variable && !var.loop_variable_enable)
				var.static_expression = phi.local_variable;
			else
			{
				flush_variable_declaration(phi.function_variable);

				// Check if we are going to write to a Phi variable that another statement will read from
				// as part of another Phi node in our target block.
				// For this case, we will need to copy phi.function_variable to a temporary, and use that for future reads.
				// This is judged to be extremely rare, so deal with it here using a simple, but suboptimal algorithm.
				bool need_saved_temporary =
				    find_if(itr + 1, end(child.phi_variables), [&](const SPIRBlock::Phi &future_phi) -> bool {
					    return future_phi.local_variable == ID(phi.function_variable) && future_phi.parent == from;
				    }) != end(child.phi_variables);

				if (need_saved_temporary)
				{
					// Need to make sure we declare the phi variable with a copy at the right scope.
					// We cannot safely declare a temporary here since we might be inside a continue block.
					if (!var.allocate_temporary_copy)
					{
						var.allocate_temporary_copy = true;
						force_recompile();
					}
					statement("_", phi.function_variable, "_copy", " = ", to_name(phi.function_variable), ";");
					temporary_phi_variables.insert(phi.function_variable);
				}

				// This might be called in continue block, so make sure we
				// use this to emit ESSL 1.0 compliant increments/decrements.
				auto lhs = to_expression(phi.function_variable);

				string rhs;
				if (temporary_phi_variables.count(phi.local_variable))
					rhs = join("_", phi.local_variable, "_copy");
				else
					rhs = to_pointer_expression(phi.local_variable);

				if (!optimize_read_modify_write(get<SPIRType>(var.basetype), lhs, rhs))
					statement(lhs, " = ", rhs, ";");
			}

			register_write(phi.function_variable);
		}
	}
}